

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O0

int acmod_process_feat(acmod_t *acmod,mfcc_t **feat)

{
  uint32 local_48;
  uint32 local_44;
  int local_30;
  int local_28;
  int local_24;
  int inptr;
  int i;
  mfcc_t **feat_local;
  acmod_t *acmod_local;
  
  if (acmod->n_feat_frame == acmod->n_feat_alloc) {
    if (acmod->grow_feat == '\0') {
      return 0;
    }
    acmod_grow_feat_buf(acmod,acmod->n_feat_alloc << 1);
  }
  if (acmod->grow_feat == '\0') {
    local_28 = (acmod->feat_outidx + acmod->n_feat_frame) % acmod->n_feat_alloc;
  }
  else {
    local_28 = acmod->feat_outidx + acmod->n_feat_frame;
    while (acmod->n_feat_alloc <= local_28 + 1) {
      acmod_grow_feat_buf(acmod,acmod->n_feat_alloc << 1);
    }
  }
  local_24 = 0;
  while( true ) {
    if (acmod->fcb->n_sv == 0) {
      local_30 = acmod->fcb->n_stream;
    }
    else {
      local_30 = acmod->fcb->n_sv;
    }
    if (local_30 <= local_24) break;
    if (acmod->fcb->lda == (mfcc_t ***)0x0) {
      if (acmod->fcb->sv_len == (uint32 *)0x0) {
        local_48 = acmod->fcb->stream_len[local_24];
      }
      else {
        local_48 = acmod->fcb->sv_len[local_24];
      }
      local_44 = local_48;
    }
    else {
      local_44 = acmod->fcb->out_dim;
    }
    memcpy(acmod->feat_buf[local_28][local_24],feat[local_24],(ulong)local_44 << 2);
    local_24 = local_24 + 1;
  }
  acmod->n_feat_frame = acmod->n_feat_frame + 1;
  if (acmod->n_feat_frame <= acmod->n_feat_alloc) {
    return 1;
  }
  __assert_fail("acmod->n_feat_frame <= acmod->n_feat_alloc",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                ,0x317,"int acmod_process_feat(acmod_t *, mfcc_t **)");
}

Assistant:

int
acmod_process_feat(acmod_t *acmod,
                   mfcc_t **feat)
{
    int i, inptr;

    if (acmod->n_feat_frame == acmod->n_feat_alloc) {
        if (acmod->grow_feat)
            acmod_grow_feat_buf(acmod, acmod->n_feat_alloc * 2);
        else
            return 0;
    }

    if (acmod->grow_feat) {
        /* Grow to avoid wraparound if grow_feat == TRUE. */
        inptr = acmod->feat_outidx + acmod->n_feat_frame;
        while (inptr + 1 >= acmod->n_feat_alloc)
            acmod_grow_feat_buf(acmod, acmod->n_feat_alloc * 2);
    }
    else {
        inptr = (acmod->feat_outidx + acmod->n_feat_frame) % acmod->n_feat_alloc;
    }
    for (i = 0; i < feat_dimension1(acmod->fcb); ++i)
        memcpy(acmod->feat_buf[inptr][i],
               feat[i], feat_dimension2(acmod->fcb, i) * sizeof(**feat));
    ++acmod->n_feat_frame;
    assert(acmod->n_feat_frame <= acmod->n_feat_alloc);

    return 1;
}